

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::date_t,_long> *state,date_t *x,long *y,
               AggregateBinaryInput *binary)

{
  ArgMinMaxState<duckdb::date_t,_long> *in_RDX;
  TemplatedValidityMask<unsigned_long> *in_RSI;
  byte *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  long in_stack_ffffffffffffffc0;
  byte *y_00;
  ArgMinMaxState<duckdb::date_t,_long> *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  if ((*in_RDI & 1) == 0) {
    y_00 = in_RDI;
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RSI,(idx_t)in_RDI);
    Assign<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>>
              (in_RDX,(date_t *)in_RSI,(long *)y_00,(bool)in_stack_ffffffffffffffbf);
    *in_RDI = 1;
  }
  else {
    Execute<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>>
              (in_stack_ffffffffffffffc8,(date_t)(int32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
               ,in_stack_ffffffffffffffc0,
               (AggregateBinaryInput *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
              );
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}